

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall capnp::DynamicValue::Reader::operator=(Reader *this,Reader *other)

{
  Reader *params;
  Reader *other_local;
  Reader *this_local;
  
  if (this->type == CAPABILITY) {
    kj::dtor<capnp::DynamicCapability::Client>(&(this->field_1).capabilityValue);
  }
  params = kj::mv<capnp::DynamicValue::Reader>(other);
  kj::ctor<capnp::DynamicValue::Reader,capnp::DynamicValue::Reader>(this,params);
  return this;
}

Assistant:

DynamicValue::Reader& DynamicValue::Reader::operator=(Reader&& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, kj::mv(other));
  return *this;
}